

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

PC * __thiscall Hpipe::Context::without(PC *__return_storage_ptr__,Context *this,CharItem *fip)

{
  size_type sVar1;
  CharItem **ppCVar2;
  uint local_b4;
  undefined1 local_b0 [4];
  uint i;
  PcMaker pm;
  CharItem *fip_local;
  Context *this_local;
  
  pm.orig = (Context *)fip;
  anon_unknown_7::PcMaker::PcMaker((PcMaker *)local_b0,this);
  local_b4 = 0;
  while( true ) {
    sVar1 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                      ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                       this);
    if (sVar1 <= local_b4) break;
    ppCVar2 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,local_b4);
    if (*ppCVar2 != (CharItem *)pm.orig) {
      ppCVar2 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,local_b4);
      anon_unknown_7::PcMaker::add((PcMaker *)local_b0,*ppCVar2,local_b4,true);
    }
    local_b4 = local_b4 + 1;
  }
  anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_b0);
  anon_unknown_7::PcMaker::~PcMaker((PcMaker *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::without( const CharItem *fip ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i )
        if ( pos[ i ] != fip )
            pm.add( pos[ i ], i );

    return pm.out();
}